

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O2

void VerifyMasterChain(AActor *self)

{
  AActor *pAVar1;
  AActor *pAVar2;
  TObjPtr<AActor> *obj;
  AActor *pAVar3;
  
  if (self != (AActor *)0x0) {
    obj = &self->master;
    pAVar3 = self;
    while (pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar2 = self, pAVar1 != (AActor *)0x0)
    {
      while( true ) {
        if (pAVar2 == pAVar1) {
          (self->master).field_0.p = (AActor *)0x0;
          return;
        }
        if (pAVar2 == pAVar3) break;
        pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pAVar2->master);
      }
      obj = &pAVar1->master;
      pAVar3 = pAVar1;
    }
  }
  return;
}

Assistant:

void VerifyMasterChain(AActor *self)
{
	// See VerifyTargetChain for detailed comments.

	if (!self) return;
	AActor *origin = self;
	AActor *next = origin->master;
	while (next) // We always care (See "VerifyTargetChain")
	{
		AActor *compare = self;
		for (;;)
		{
			if (compare == next)
			{
				self->master = NULL;
				return;
			}
			if (compare == origin) break;
			compare = compare->master;
		}

		origin = next;
		next = next->master;
	}
}